

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_Subscriptions_new
          (UA_Client *client,UA_SubscriptionSettings settings,UA_UInt32 *newSubscriptionId)

{
  UA_Client_Subscription *pUVar1;
  UA_Client_Subscription *pUVar2;
  long lVar3;
  UA_UInt32 *pUVar4;
  undefined8 *puVar5;
  byte bVar6;
  UA_CreateSubscriptionRequest in_stack_fffffffffffffe18;
  UA_Client_Subscription *newSub;
  undefined1 local_140 [4];
  UA_StatusCode retval;
  UA_CreateSubscriptionResponse response;
  UA_CreateSubscriptionRequest request;
  UA_UInt32 *newSubscriptionId_local;
  UA_Client *client_local;
  
  bVar6 = 0;
  UA_CreateSubscriptionRequest_init((UA_CreateSubscriptionRequest *)&response.revisedLifetimeCount);
  pUVar4 = &response.revisedLifetimeCount;
  puVar5 = (undefined8 *)&stack0xfffffffffffffe18;
  for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pUVar4;
    pUVar4 = pUVar4 + (ulong)bVar6 * -4 + 2;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  UA_Client_Service_createSubscription
            ((UA_CreateSubscriptionResponse *)local_140,client,in_stack_fffffffffffffe18);
  newSub._4_4_ = response.responseHeader.timestamp._4_4_;
  if (response.responseHeader.timestamp._4_4_ == 0) {
    pUVar2 = (UA_Client_Subscription *)malloc(0x38);
    if (pUVar2 == (UA_Client_Subscription *)0x0) {
      newSub._4_4_ = 0x80030000;
    }
    else {
      (pUVar2->monitoredItems).lh_first = (UA_Client_MonitoredItem *)0x0;
      pUVar2->lifeTime = response.revisedPublishingInterval._0_4_;
      pUVar2->keepAliveCount = response.revisedPublishingInterval._4_4_;
      pUVar2->publishingInterval = (UA_Double)response._136_8_;
      pUVar2->subscriptionID = response.responseHeader.additionalHeader.content._32_4_;
      pUVar2->notificationsPerPublish = settings.maxNotificationsPerPublish;
      pUVar2->priority = (uint)settings.priority;
      pUVar1 = (client->subscriptions).lh_first;
      (pUVar2->listEntry).le_next = pUVar1;
      if (pUVar1 != (UA_Client_Subscription *)0x0) {
        (((client->subscriptions).lh_first)->listEntry).le_prev = (UA_Client_Subscription **)pUVar2;
      }
      (client->subscriptions).lh_first = pUVar2;
      (pUVar2->listEntry).le_prev = &(client->subscriptions).lh_first;
      if (newSubscriptionId != (UA_UInt32 *)0x0) {
        *newSubscriptionId = pUVar2->subscriptionID;
      }
    }
  }
  UA_CreateSubscriptionResponse_deleteMembers((UA_CreateSubscriptionResponse *)local_140);
  return newSub._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_new(UA_Client *client, UA_SubscriptionSettings settings,
                            UA_UInt32 *newSubscriptionId) {
    UA_CreateSubscriptionRequest request;
    UA_CreateSubscriptionRequest_init(&request);
    request.requestedPublishingInterval = settings.requestedPublishingInterval;
    request.requestedLifetimeCount = settings.requestedLifetimeCount;
    request.requestedMaxKeepAliveCount = settings.requestedMaxKeepAliveCount;
    request.maxNotificationsPerPublish = settings.maxNotificationsPerPublish;
    request.publishingEnabled = settings.publishingEnabled;
    request.priority = settings.priority;

    UA_CreateSubscriptionResponse response = UA_Client_Service_createSubscription(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    UA_Client_Subscription *newSub = UA_malloc(sizeof(UA_Client_Subscription));
    if(!newSub) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    LIST_INIT(&newSub->monitoredItems);
    newSub->lifeTime = response.revisedLifetimeCount;
    newSub->keepAliveCount = response.revisedMaxKeepAliveCount;
    newSub->publishingInterval = response.revisedPublishingInterval;
    newSub->subscriptionID = response.subscriptionId;
    newSub->notificationsPerPublish = request.maxNotificationsPerPublish;
    newSub->priority = request.priority;
    LIST_INSERT_HEAD(&client->subscriptions, newSub, listEntry);

    if(newSubscriptionId)
        *newSubscriptionId = newSub->subscriptionID;

 cleanup:
    UA_CreateSubscriptionResponse_deleteMembers(&response);
    return retval;
}